

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath.hpp
# Opt level: O0

void __thiscall
jsoncons::jmespath::
parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::parameter
          (parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                 *other)

{
  parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *other_local;
  parameter<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> *this_local
  ;
  
  this->type_ = other->type_;
  if (this->type_ == value) {
    this->field_1 = other->field_1;
  }
  else if (this->type_ == expression) {
    this->field_1 = other->field_1;
  }
  return;
}

Assistant:

parameter(const parameter<Json>& other) noexcept
            : type_(other.type_)
        {
            switch (type_)
            {
                case parameter_kind::expression:
                    expression_ = other.expression_;
                    break;
                case parameter_kind::value:
                    value_ = other.value_;
                    break;
                default:
                    break;
            }
        }